

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::Vector<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::~Vector
          (Vector<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *this)

{
  FlattenedField *pFVar1;
  RemoveConst<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *pRVar2;
  FlattenedField *pFVar3;
  ArrayDisposer *pAVar4;
  
  pFVar1 = (this->builder).ptr;
  if (pFVar1 != (FlattenedField *)0x0) {
    pRVar2 = (this->builder).pos;
    pFVar3 = (this->builder).endPtr;
    (this->builder).ptr = (FlattenedField *)0x0;
    (this->builder).pos = (RemoveConst<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *)0x0;
    (this->builder).endPtr = (FlattenedField *)0x0;
    pAVar4 = (this->builder).disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pFVar1,0xb8,((long)pRVar2 - (long)pFVar1 >> 3) * -0x2c8590b21642c859,
               ((long)pFVar3 - (long)pFVar1 >> 3) * -0x2c8590b21642c859,
               ArrayDisposer::Dispose_<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::destruct
              );
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }